

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch.c
# Opt level: O0

void branch_exchange(arm7tdmi_t *state,arminstr_t *arminstr)

{
  uint uVar1;
  uint *in_RSI;
  long in_RDI;
  _Bool thumb;
  uint32_t newpc;
  branch_exchange_t *instr;
  uint32_t value;
  ulong in_stack_ffffffffffffff98;
  uint32_t new_pc;
  arm7tdmi_t *in_stack_ffffffffffffffa0;
  uint local_30;
  uint local_14;
  uint local_4;
  
  new_pc = (uint32_t)(in_stack_ffffffffffffff98 >> 0x20);
  uVar1 = *in_RSI >> 4 & 0xf;
  if (uVar1 == 1) {
    uVar1 = *in_RSI & 0xf;
    if ((((*(uint *)(in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar1)) && (uVar1 < 0xd)) {
      local_30 = *(uint *)(in_RDI + 0x6c + (ulong)(uVar1 - 8) * 4);
    }
    else if (uVar1 < 0xd) {
      local_30 = *(uint *)(in_RDI + 0x38 + (ulong)uVar1 * 4);
    }
    else if (uVar1 == 0xd) {
      in_stack_ffffffffffffffa0 = (arm7tdmi_t *)(ulong)((*(uint *)(in_RDI + 0xb4) & 0x1f) - 0x11);
      switch(in_stack_ffffffffffffffa0) {
      case (arm7tdmi_t *)0x0:
        local_14 = *(uint *)(in_RDI + 0x84);
        break;
      case (arm7tdmi_t *)0x1:
        local_14 = *(uint *)(in_RDI + 0x90);
        break;
      case (arm7tdmi_t *)0x2:
        local_14 = *(uint *)(in_RDI + 0x88);
        break;
      default:
        local_14 = *(uint *)(in_RDI + 0x80);
        break;
      case (arm7tdmi_t *)0x6:
        local_14 = *(uint *)(in_RDI + 0x8c);
        break;
      case (arm7tdmi_t *)0xa:
        local_14 = *(uint *)(in_RDI + 0x94);
      }
      local_30 = local_14;
    }
    else {
      if (uVar1 == 0xe) {
        in_stack_ffffffffffffff98 = (ulong)((*(uint *)(in_RDI + 0xb4) & 0x1f) - 0x11);
        switch(in_stack_ffffffffffffff98) {
        case 0:
          local_4 = *(uint *)(in_RDI + 0x9c);
          break;
        case 1:
          local_4 = *(uint *)(in_RDI + 0xa8);
          break;
        case 2:
          local_4 = *(uint *)(in_RDI + 0xa0);
          break;
        default:
          local_4 = *(uint *)(in_RDI + 0x98);
          break;
        case 6:
          local_4 = *(uint *)(in_RDI + 0xa4);
          break;
        case 10:
          local_4 = *(uint *)(in_RDI + 0xac);
        }
        local_30 = local_4;
      }
      else {
        if (uVar1 != 0xf) {
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
                  ,0xa4);
          fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar1);
          exit(1);
        }
        local_30 = *(uint *)(in_RDI + 0xb0);
      }
      new_pc = (uint32_t)(in_stack_ffffffffffffff98 >> 0x20);
    }
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] [BX] Hold on to your hats, we\'re jumping to 0x%02X - from r%d\n",
             (ulong)local_30,(ulong)(*in_RSI & 0xf));
    }
    if (((local_30 & 1) != 0) && (2 < gba_log_verbosity)) {
      printf("[DEBUG] REALLY hang on, we\'re entering THUMB mode!\n");
    }
    set_pc(in_stack_ffffffffffffffa0,new_pc);
    return;
  }
  if (uVar1 == 2) {
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/branch.c"
            ,0x10);
    fprintf(_stderr,"BXJ: This implementation does not support Jazelle mode!\n\x1b[0;m");
    exit(1);
  }
  if (uVar1 != 3) {
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/branch.c"
            ,0x14);
    fprintf(_stderr,"BRANCH_EXCHANGE: Unimplemented opcode %d\n\x1b[0;m",(ulong)(*in_RSI >> 4 & 0xf)
           );
    exit(1);
  }
  fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
          "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/branch.c"
          ,0x12);
  fprintf(_stderr,"BLX unimplemented\n\x1b[0;m");
  exit(1);
}

Assistant:

void branch_exchange(arm7tdmi_t* state, arminstr_t * arminstr) {
    branch_exchange_t* instr = &arminstr->parsed.BRANCH_EXCHANGE;
    switch (instr->opcode) {
        case 0b0001: {// BX
            word newpc = get_register(state, instr->rn);
            bool thumb = newpc & 1u;
            logdebug("[BX] Hold on to your hats, we're jumping to 0x%02X - from r%d", newpc, instr->rn)
            if (thumb) logdebug("REALLY hang on, we're entering THUMB mode!")
            set_pc(state, newpc);
            break;
        }
        case 0b0010: // BXJ
            logfatal("BXJ: This implementation does not support Jazelle mode!")
        case 0b0011: // BLX
            logfatal("BLX unimplemented")
        default:
            logfatal("BRANCH_EXCHANGE: Unimplemented opcode %d", instr->opcode)

    }

}